

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

void __thiscall
capnp::compiler::CompilerMain::writeConversion
          (CompilerMain *this,Reader reader,OutputStream *output)

{
  TextCodec *this_00;
  initializer_list<kj::ArrayPtr<const_unsigned_char>_> init;
  initializer_list<kj::ArrayPtr<const_unsigned_char>_> init_00;
  ArrayDisposer *pAVar1;
  word *pwVar2;
  size_t sVar3;
  ArrayPtr<capnp::word> AVar4;
  MessageSize MVar5;
  ArrayPtr<capnp::word> AVar6;
  ArrayPtr<const_unsigned_char> AVar7;
  ArrayPtr<unsigned_char> AVar8;
  uint local_514;
  uint local_504;
  ArrayPtr<unsigned_char> local_4e8;
  ArrayPtr<const_unsigned_char> local_4d8;
  ArrayPtr<const_unsigned_char> local_4c8;
  iterator local_4b8;
  undefined8 local_4b0;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> local_4a8;
  Schema local_498;
  Reader local_490;
  undefined1 local_458 [8];
  String text_1;
  undefined1 local_438 [8];
  JsonCodec codec_1;
  ArrayPtr<const_unsigned_char> local_418;
  ArrayPtr<const_unsigned_char> local_408;
  iterator local_3f8;
  undefined8 local_3f0;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> local_3e8;
  Schema local_3d8;
  Reader local_3d0;
  undefined1 local_398 [8];
  String text;
  uchar *puStack_378;
  TextCodec codec;
  undefined1 local_358 [8];
  Array<capnp::word> words_2;
  undefined1 local_320 [8];
  PackedOutputStream packed;
  undefined1 local_300 [8];
  BufferedOutputStreamWrapper buffered;
  ArrayPtr<unsigned_char> local_2a8;
  uint64_t local_298;
  uint local_290;
  undefined1 local_288 [8];
  Array<capnp::word> words_1;
  ArrayPtr<unsigned_char> local_240;
  uint64_t local_230;
  uint local_228;
  undefined1 local_220 [8];
  Array<capnp::word> words;
  MallocMessageBuilder message_1;
  undefined1 local_108 [8];
  MallocMessageBuilder message;
  OutputStream *output_local;
  CompilerMain *this_local;
  
  message.moreSegments.builder.disposer = (ArrayDisposer *)output;
  switch(this->convertTo) {
  case BINARY:
    if (this->segmentSize == 0) {
      local_504 = 0x400;
    }
    else {
      local_504 = this->segmentSize;
    }
    MallocMessageBuilder::MallocMessageBuilder
              ((MallocMessageBuilder *)local_108,local_504,this->segmentSize == 0);
    MessageBuilder::setRoot<capnp::AnyStruct::Reader&>((MessageBuilder *)local_108,&reader);
    writeMessage((OutputStream *)message.moreSegments.builder.disposer,(MessageBuilder *)local_108);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_108);
    break;
  case PACKED:
    if (this->segmentSize == 0) {
      local_514 = 0x400;
    }
    else {
      local_514 = this->segmentSize;
    }
    MallocMessageBuilder::MallocMessageBuilder
              ((MallocMessageBuilder *)&words.disposer,local_514,this->segmentSize == 0);
    MessageBuilder::setRoot<capnp::AnyStruct::Reader&>((MessageBuilder *)&words.disposer,&reader);
    writePackedMessage((OutputStream *)message.moreSegments.builder.disposer,
                       (MessageBuilder *)&words.disposer);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&words.disposer);
    break;
  case FLAT:
    MVar5 = AnyStruct::Reader::totalSize(&reader);
    local_230 = MVar5.wordCount;
    local_228 = MVar5.capCount;
    kj::heapArray<capnp::word>((Array<capnp::word> *)local_220,local_230 + 1);
    pwVar2 = kj::Array<capnp::word>::begin((Array<capnp::word> *)local_220);
    local_240 = kj::Array<capnp::word>::asBytes((Array<capnp::word> *)local_220);
    sVar3 = kj::ArrayPtr<unsigned_char>::size(&local_240);
    memset(pwVar2,0,sVar3);
    AVar4 = kj::Array::operator_cast_to_ArrayPtr((Array *)local_220);
    AVar6.ptr = (word *)AVar4.size_;
    AVar6.size_ = (size_t)AVar4.ptr;
    copyToUnchecked<capnp::AnyStruct::Reader&>((capnp *)&reader,(Reader *)AVar4.ptr,AVar6);
    pAVar1 = message.moreSegments.builder.disposer;
    AVar8 = kj::Array<capnp::word>::asBytes((Array<capnp::word> *)local_220);
    words_1.disposer = (ArrayDisposer *)AVar8.ptr;
    AVar7 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&words_1.disposer);
    (*pAVar1->_vptr_ArrayDisposer[2])(pAVar1,AVar7.ptr,AVar7.size_);
    kj::Array<capnp::word>::~Array((Array<capnp::word> *)local_220);
    break;
  case FLAT_PACKED:
    MVar5 = AnyStruct::Reader::totalSize(&reader);
    local_298 = MVar5.wordCount;
    local_290 = MVar5.capCount;
    kj::heapArray<capnp::word>((Array<capnp::word> *)local_288,local_298 + 1);
    pwVar2 = kj::Array<capnp::word>::begin((Array<capnp::word> *)local_288);
    local_2a8 = kj::Array<capnp::word>::asBytes((Array<capnp::word> *)local_288);
    sVar3 = kj::ArrayPtr<unsigned_char>::size(&local_2a8);
    memset(pwVar2,0,sVar3);
    AVar6 = kj::Array::operator_cast_to_ArrayPtr((Array *)local_288);
    AVar4.ptr = (word *)AVar6.size_;
    buffered._64_8_ = AVar6.ptr;
    AVar4.size_ = buffered._64_8_;
    copyToUnchecked<capnp::AnyStruct::Reader&>((capnp *)&reader,(Reader *)buffered._64_8_,AVar4);
    pAVar1 = message.moreSegments.builder.disposer;
    kj::ArrayPtr<unsigned_char>::ArrayPtr((ArrayPtr<unsigned_char> *)&packed.inner,(void *)0x0);
    kj::BufferedOutputStreamWrapper::BufferedOutputStreamWrapper
              ((BufferedOutputStreamWrapper *)local_300,(OutputStream *)pAVar1,
               stack0xfffffffffffffcf0);
    capnp::_::PackedOutputStream::PackedOutputStream
              ((PackedOutputStream *)local_320,(BufferedOutputStream *)local_300);
    AVar8 = kj::Array<capnp::word>::asBytes((Array<capnp::word> *)local_288);
    words_2.disposer = (ArrayDisposer *)AVar8.ptr;
    AVar7 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&words_2.disposer);
    capnp::_::PackedOutputStream::write
              ((PackedOutputStream *)local_320,(int)AVar7.ptr,(void *)AVar7.size_,(size_t)AVar7.ptr)
    ;
    capnp::_::PackedOutputStream::~PackedOutputStream((PackedOutputStream *)local_320);
    kj::BufferedOutputStreamWrapper::~BufferedOutputStreamWrapper
              ((BufferedOutputStreamWrapper *)local_300);
    kj::Array<capnp::word>::~Array((Array<capnp::word> *)local_288);
    break;
  case CANONICAL:
    AnyStruct::Reader::canonicalize((Array<capnp::word> *)local_358,&reader);
    pAVar1 = message.moreSegments.builder.disposer;
    AVar8 = kj::Array<capnp::word>::asBytes((Array<capnp::word> *)local_358);
    puStack_378 = AVar8.ptr;
    AVar7 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&stack0xfffffffffffffc88);
    (*pAVar1->_vptr_ArrayDisposer[2])(pAVar1,AVar7.ptr,AVar7.size_);
    kj::Array<capnp::word>::~Array((Array<capnp::word> *)local_358);
    break;
  case TEXT:
    this_00 = (TextCodec *)((long)&text.content.disposer + 7);
    TextCodec::TextCodec(this_00);
    TextCodec::setPrettyPrint(this_00,(bool)(this->pretty & 1));
    local_3d8.raw = (this->rootType).super_Schema.raw;
    AnyStruct::Reader::as<capnp::DynamicStruct>(&local_3d0,&reader,(StructSchema)local_3d8.raw);
    TextCodec::encode<capnp::DynamicStruct::Reader>
              ((String *)local_398,(TextCodec *)((long)&text.content.disposer + 7),&local_3d0);
    pAVar1 = message.moreSegments.builder.disposer;
    AVar8 = kj::String::asBytes((String *)local_398);
    codec_1.impl.ptr = (Impl *)AVar8.ptr;
    local_418 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&codec_1.impl.ptr);
    local_408 = operator___kjb<kj::_::ByteLiteral<2UL>__10__>();
    local_3f8 = &local_418;
    local_3f0 = 2;
    init_00._M_len = 2;
    init_00._M_array = local_3f8;
    kj::ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::ArrayPtr(&local_3e8,init_00);
    (*pAVar1->_vptr_ArrayDisposer[3])(pAVar1,local_3e8.ptr,local_3e8.size_);
    kj::String::~String((String *)local_398);
    TextCodec::~TextCodec((TextCodec *)((long)&text.content.disposer + 7));
    break;
  case JSON:
    JsonCodec::JsonCodec((JsonCodec *)local_438);
    JsonCodec::setPrettyPrint((JsonCodec *)local_438,(bool)(this->pretty & 1));
    text_1.content.disposer = (ArrayDisposer *)(this->rootType).super_Schema.raw;
    JsonCodec::handleByAnnotation((JsonCodec *)local_438,(Schema)text_1.content.disposer);
    local_498.raw = (this->rootType).super_Schema.raw;
    AnyStruct::Reader::as<capnp::DynamicStruct>(&local_490,&reader,(StructSchema)local_498.raw);
    JsonCodec::encode<capnp::DynamicStruct::Reader>
              ((String *)local_458,(JsonCodec *)local_438,&local_490);
    pAVar1 = message.moreSegments.builder.disposer;
    local_4e8 = kj::String::asBytes((String *)local_458);
    local_4d8 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_4e8);
    local_4c8 = operator___kjb<kj::_::ByteLiteral<2UL>__10__>();
    local_4b8 = &local_4d8;
    local_4b0 = 2;
    init._M_len = 2;
    init._M_array = local_4b8;
    kj::ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::ArrayPtr(&local_4a8,init);
    (*pAVar1->_vptr_ArrayDisposer[3])(pAVar1,local_4a8.ptr,local_4a8.size_);
    kj::String::~String((String *)local_458);
    JsonCodec::~JsonCodec((JsonCodec *)local_438);
    break;
  default:
    kj::_::unreachable();
  }
  return;
}

Assistant:

void writeConversion(AnyStruct::Reader reader, kj::OutputStream& output) {
    switch (convertTo) {
      case Format::BINARY: {
        MallocMessageBuilder message(
            segmentSize == 0 ? SUGGESTED_FIRST_SEGMENT_WORDS : segmentSize,
            segmentSize == 0 ? SUGGESTED_ALLOCATION_STRATEGY : AllocationStrategy::FIXED_SIZE);
        message.setRoot(reader);
        capnp::writeMessage(output, message);
        return;
      }
      case Format::PACKED: {
        MallocMessageBuilder message(
            segmentSize == 0 ? SUGGESTED_FIRST_SEGMENT_WORDS : segmentSize,
            segmentSize == 0 ? SUGGESTED_ALLOCATION_STRATEGY : AllocationStrategy::FIXED_SIZE);
        message.setRoot(reader);
        capnp::writePackedMessage(output, message);
        return;
      }
      case Format::FLAT: {
        auto words = kj::heapArray<word>(reader.totalSize().wordCount + 1);
        memset(words.begin(), 0, words.asBytes().size());
        copyToUnchecked(reader, words);
        output.write(words.asBytes());
        return;
      }
      case Format::FLAT_PACKED: {
        auto words = kj::heapArray<word>(reader.totalSize().wordCount + 1);
        memset(words.begin(), 0, words.asBytes().size());
        copyToUnchecked(reader, words);
        kj::BufferedOutputStreamWrapper buffered(output);
        capnp::_::PackedOutputStream packed(buffered);
        packed.write(words.asBytes());
        return;
      }
      case Format::CANONICAL: {
        auto words = reader.canonicalize();
        output.write(words.asBytes());
        return;
      }
      case Format::TEXT: {
        TextCodec codec;
        codec.setPrettyPrint(pretty);
        auto text = codec.encode(reader.as<DynamicStruct>(rootType));
        output.write({text.asBytes(), "\n"_kjb});
        return;
      }
      case Format::JSON: {
        JsonCodec codec;
        codec.setPrettyPrint(pretty);
        codec.handleByAnnotation(rootType);
        auto text = codec.encode(reader.as<DynamicStruct>(rootType));
        output.write({text.asBytes(), "\n"_kjb});
        return;
      }
    }

    KJ_UNREACHABLE;
  }